

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizard::setField(QWizard *this,QString *name,QVariant *value)

{
  bool bVar1;
  int iVar2;
  QWizardPrivate *this_00;
  undefined8 uVar3;
  const_reference this_01;
  char *pcVar4;
  QString *in_RSI;
  long in_FS_OFFSET;
  QWizardField *field;
  int index;
  QWizardPrivate *d;
  char *in_stack_ffffffffffffff78;
  QObject *name_00;
  int *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  char local_50 [32];
  char local_30 [36];
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QWizard *)0x7bb155);
  local_c = 0xffffffff;
  iVar2 = QMap<QString,_int>::value
                    ((QMap<QString,_int> *)this_00,
                     (QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     in_stack_ffffffffffffff80);
  if (iVar2 == -1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)CONCAT44(0xffffffff,in_stack_ffffffffffffff88),
               (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),in_stack_ffffffffffffff78);
    QtPrivate::asString(in_RSI);
    uVar3 = QString::utf16();
    QMessageLogger::warning(local_30,"QWizard::setField: No such field \'%ls\'",uVar3);
  }
  else {
    this_01 = QList<QWizardField>::at
                        ((QList<QWizardField> *)&DAT_aaaaaaaaaaaaaaaa,
                         (qsizetype)in_stack_ffffffffffffff78);
    name_00 = this_01->object;
    QByteArray::operator_cast_to_char_((QByteArray *)0x7bb218);
    bVar1 = QObject::setProperty((QObject *)this_01,(char *)name_00,(QVariant *)0x7bb229);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)CONCAT44(iVar2,in_stack_ffffffffffffff88),
                 (int)((ulong)this_01 >> 0x20),(char *)name_00);
      pcVar4 = QByteArray::constData((QByteArray *)0x7bb256);
      QMessageLogger::warning
                (local_50,"QWizard::setField: Couldn\'t write to property \'%s\'",pcVar4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizard::setField(const QString &name, const QVariant &value)
{
    Q_D(QWizard);

    int index = d->fieldIndexMap.value(name, -1);
    if (Q_UNLIKELY(index == -1)) {
        qWarning("QWizard::setField: No such field '%ls'", qUtf16Printable(name));
        return;
    }

    const QWizardField &field = d->fields.at(index);
    if (Q_UNLIKELY(!field.object->setProperty(field.property, value)))
        qWarning("QWizard::setField: Couldn't write to property '%s'",
                 field.property.constData());
}